

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *bitD)

{
  size_t sVar1;
  BIT_DStream_t *bitD_local;
  
  if (bitD->ptr < bitD->limitPtr) {
    bitD_local._4_4_ = BIT_DStream_overflow;
  }
  else {
    if (0x40 < bitD->bitsConsumed) {
      __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
    }
    bitD->ptr = bitD->ptr + -(ulong)(bitD->bitsConsumed >> 3);
    bitD->bitsConsumed = bitD->bitsConsumed & 7;
    sVar1 = MEM_readLEST(bitD->ptr);
    bitD->bitContainer = sVar1;
    bitD_local._4_4_ = BIT_DStream_unfinished;
  }
  return bitD_local._4_4_;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t* bitD)
{
    if (UNLIKELY(bitD->ptr < bitD->limitPtr))
        return BIT_DStream_overflow;
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}